

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

char * isEnv(Proto *p,int pc,Instruction i,int isup)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  char *local_28;
  char *name;
  int t;
  int isup_local;
  Instruction i_local;
  int pc_local;
  Proto *p_local;
  
  name._0_4_ = i >> 0x10 & 0xff;
  name._4_4_ = isup;
  t = i;
  isup_local = pc;
  _i_local = p;
  if (isup == 0) {
    basicgetobjname(p,&isup_local,(uint)name,&local_28);
  }
  else {
    local_28 = upvalname(p,(uint)name);
  }
  bVar3 = false;
  if (local_28 != (char *)0x0) {
    iVar1 = strcmp(local_28,"_ENV");
    bVar3 = iVar1 == 0;
  }
  pcVar2 = "field";
  if (bVar3) {
    pcVar2 = "global";
  }
  return pcVar2;
}

Assistant:

static const char *isEnv (const Proto *p, int pc, Instruction i, int isup) {
  int t = GETARG_B(i);  /* table index */
  const char *name;  /* name of indexed variable */
  if (isup)  /* is 't' an upvalue? */
    name = upvalname(p, t);
  else  /* 't' is a register */
    basicgetobjname(p, &pc, t, &name);
  return (name && strcmp(name, LUA_ENV) == 0) ? "global" : "field";
}